

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

double ZopfliCalculateBlockSizeAutoType(ZopfliLZ77Store *lz77,size_t lstart,size_t lend)

{
  long lVar1;
  size_t sVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  uint d_lengths [32];
  uint ll_lengths [288];
  uint local_518 [32];
  uint local_498 [288];
  
  sVar2 = ZopfliLZ77GetByteRange(lz77,lstart,lend);
  lVar1 = sVar2 * 8 + ((ulong)(0x1000100010001 < sVar2 * -0x1000100010001) + sVar2 / 0xffff) * 0x28;
  auVar5._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar5._0_8_ = lVar1;
  auVar5._12_4_ = 0x45300000;
  dVar6 = (auVar5._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0);
  dVar3 = dVar6;
  if (lz77->size < 0x3e9) {
    dVar3 = ZopfliCalculateBlockSize(lz77,lstart,lend,1);
  }
  dVar4 = GetDynamicLengths(lz77,lstart,lend,local_498,local_518);
  dVar4 = dVar4 + 3.0;
  if ((dVar3 <= dVar6 || dVar4 <= dVar6) && (dVar6 = dVar3, dVar4 <= dVar3)) {
    dVar6 = dVar4;
  }
  return dVar6;
}

Assistant:

double ZopfliCalculateBlockSizeAutoType(const ZopfliLZ77Store* lz77,
                                        size_t lstart, size_t lend) {
  double uncompressedcost = ZopfliCalculateBlockSize(lz77, lstart, lend, 0);
  /* Don't do the expensive fixed cost calculation for larger blocks that are
     unlikely to use it. */
  double fixedcost = (lz77->size > 1000) ?
      uncompressedcost : ZopfliCalculateBlockSize(lz77, lstart, lend, 1);
  double dyncost = ZopfliCalculateBlockSize(lz77, lstart, lend, 2);
  return (uncompressedcost < fixedcost && uncompressedcost < dyncost)
      ? uncompressedcost
      : (fixedcost < dyncost ? fixedcost : dyncost);
}